

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng_test.c
# Opt level: O1

bool_t rngTest(void)

{
  char *source;
  ulong count;
  err_t eVar1;
  bool_t bVar2;
  bool_t bVar3;
  bool_t bVar4;
  bool_t bVar5;
  uint uVar6;
  long lVar7;
  size_t read;
  char hex [33];
  octet buf [2500];
  uint local_a38;
  undefined4 uStack_a34;
  uint local_a2c;
  char local_a28 [48];
  octet local_9f8 [2504];
  
  lVar7 = 0;
  do {
    source = *(char **)((long)&PTR_anon_var_dwarf_3ed3_00175d40 + lVar7);
    eVar1 = rngESRead((size_t *)&local_a38,local_9f8,0x9c4,source);
    if (eVar1 == 0) {
      count = CONCAT44(uStack_a34,local_a38);
      if (count == 0x9c4) {
        hexFrom(local_a28,local_9f8,0x10);
        bVar2 = rngTestFIPS1(local_9f8);
        local_a2c = (uint)(bVar2 == 0) * 2 + 0x2b;
        bVar2 = rngTestFIPS2(local_9f8);
        bVar3 = rngTestFIPS3(local_9f8);
        bVar4 = rngTestFIPS4(local_9f8);
        printf("rngSource[%5s]: %s... [FIPS: 1%c 2%c 3%c 4%c]\n",source,local_a28,(ulong)local_a2c,
               (ulong)((uint)(bVar2 == 0) * 2 + 0x2b),(ulong)((uint)(bVar3 == 0) * 2 + 0x2b),
               (uint)(bVar4 == 0) * 2 + 0x2b);
      }
      else if (count < 0x11) {
        hexFrom(local_a28,local_9f8,count);
        printf("rngSource[%5s]: %s\n",source,local_a28);
      }
      else {
        hexFrom(local_a28,local_9f8,0x10);
        printf("rngSource[%5s]: %s... (%u bytes)\n",source,local_a28,(ulong)local_a38);
      }
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x28);
  uVar6 = 0;
  eVar1 = rngCreate((read_i)0x0,(void *)0x0);
  if (eVar1 == 0) {
    uVar6 = 0;
    bVar2 = rngIsValid();
    if (bVar2 != 0) {
      uVar6 = 0;
      rngStepR(local_9f8,0x9c4,(void *)0x0);
      hexFrom(local_a28,local_9f8,0x10);
      bVar2 = rngTestFIPS1(local_9f8);
      bVar3 = rngTestFIPS2(local_9f8);
      bVar4 = rngTestFIPS3(local_9f8);
      bVar5 = rngTestFIPS4(local_9f8);
      printf("rngStepR:         %s... [FIPS: 1%c 2%c 3%c 4%c]\n",local_a28,
             (ulong)((uint)(bVar2 == 0) * 2 + 0x2b),(ulong)((uint)(bVar3 == 0) * 2 + 0x2b),
             (ulong)((uint)(bVar4 == 0) * 2 + 0x2b),(ulong)((uint)(bVar5 == 0) * 2 + 0x2b));
      rngRekey();
      rngStepR2(local_9f8,0x9c4,(void *)0x0);
      hexFrom(local_a28,local_9f8,0x10);
      bVar2 = rngTestFIPS1(local_9f8);
      bVar3 = rngTestFIPS2(local_9f8);
      bVar4 = rngTestFIPS3(local_9f8);
      bVar5 = rngTestFIPS4(local_9f8);
      printf("rngStepR2:        %s... [FIPS: 1%c 2%c 3%c 4%c]\n",local_a28,
             (ulong)((uint)(bVar2 == 0) * 2 + 0x2b),(ulong)((uint)(bVar3 == 0) * 2 + 0x2b),
             (ulong)((uint)(bVar4 == 0) * 2 + 0x2b),(ulong)((uint)(bVar5 == 0) * 2 + 0x2b));
      eVar1 = rngCreate((read_i)0x0,(void *)0x0);
      if (eVar1 == 0) {
        uVar6 = 0;
        rngClose();
        bVar2 = rngIsValid();
        if (bVar2 != 0) {
          rngClose();
          bVar2 = rngIsValid();
          uVar6 = (uint)(bVar2 == 0);
        }
      }
    }
  }
  return uVar6;
}

Assistant:

bool_t rngTest()
{
	const char* sources[] = { "trng", "trng2", "sys", "sys2", "timer" };
	octet buf[2500];
	char hex[33];
	size_t read;
	size_t pos;
	// пробежать источники
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
	{
		if (rngESRead(&read, buf, 2500, sources[pos]) == ERR_OK)
		{
			if (read == 2500)
				hexFrom(hex, buf, 16),
				printf("rngSource[%5s]: %s... [FIPS: 1%c 2%c 3%c 4%c]\n",
					sources[pos],
					hex,
					rngTestFIPS1(buf) ? '+' : '-',
					rngTestFIPS2(buf) ? '+' : '-',
					rngTestFIPS3(buf) ? '+' : '-',
					rngTestFIPS4(buf) ? '+' : '-');
			else if (read > 16)
				hexFrom(hex, buf, 16),
				printf("rngSource[%5s]: %s... (%u bytes)\n",
					sources[pos], hex, (unsigned)read);
			else
				hexFrom(hex, buf, read),
				printf("rngSource[%5s]: %s\n", sources[pos], hex);
		}
	}
	// работа с ГСЧ
	if (rngCreate(0, 0) != ERR_OK)
		return FALSE;
	if (!rngIsValid())
		return FALSE;
	rngStepR(buf, 2500, 0);
	hexFrom(hex, buf, 16);
	printf("rngStepR:         %s... [FIPS: 1%c 2%c 3%c 4%c]\n",
		hex,
		rngTestFIPS1(buf) ? '+' : '-',
		rngTestFIPS2(buf) ? '+' : '-',
		rngTestFIPS3(buf) ? '+' : '-',
		rngTestFIPS4(buf) ? '+' : '-');
	rngRekey();
	rngStepR2(buf, 2500, 0);
	hexFrom(hex, buf, 16);
	printf("rngStepR2:        %s... [FIPS: 1%c 2%c 3%c 4%c]\n",
		hex,
		rngTestFIPS1(buf) ? '+' : '-',
		rngTestFIPS2(buf) ? '+' : '-',
		rngTestFIPS3(buf) ? '+' : '-',
		rngTestFIPS4(buf) ? '+' : '-');
	if (rngCreate(0, 0) != ERR_OK)
		return FALSE;
	rngClose();
	if (!rngIsValid())
		return FALSE;
	rngClose();
	if (rngIsValid())
		return FALSE;
	// все нормально
	return TRUE;
}